

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxu.c
# Opt level: O1

void Fxu_MatrixRingCubesUnmark(Fxu_Matrix *p)

{
  Fxu_Cube *pFVar1;
  Fxu_Cube *pFVar2;
  Fxu_Cube *pFVar3;
  
  pFVar2 = p->pOrderCubes;
  if (pFVar2 != (Fxu_Cube *)0x0) {
    pFVar3 = pFVar2;
    pFVar1 = (Fxu_Cube *)0x1;
    if (pFVar2 == (Fxu_Cube *)0x1) goto LAB_0043bf9c;
    do {
      pFVar3 = pFVar2;
      pFVar1 = pFVar2->pOrder;
LAB_0043bf9c:
      while( true ) {
        pFVar2 = pFVar1;
        if (pFVar3 == (Fxu_Cube *)0x1) goto LAB_0043bfba;
        pFVar3->pOrder = (Fxu_Cube *)0x0;
        if (pFVar2 != (Fxu_Cube *)0x1) break;
        pFVar3 = pFVar2;
        pFVar1 = (Fxu_Cube *)0x1;
      }
    } while( true );
  }
LAB_0043bfba:
  p->pOrderCubes = (Fxu_Cube *)0x0;
  p->ppTailCubes = (Fxu_Cube **)0x0;
  return;
}

Assistant:

void Fxu_MatrixRingCubesUnmark( Fxu_Matrix * p )
{
	Fxu_Cube * pCube, * pCube2;
    // unmark the cubes
    Fxu_MatrixForEachCubeInRingSafe( p, pCube, pCube2 )
        pCube->pOrder = NULL;
    Fxu_MatrixRingCubesReset( p );
}